

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::and_d8(SM83 *this)

{
  u8 *puVar1;
  u16 addr;
  byte bVar2;
  string_view fmt;
  format_args args;
  ulong local_88 [2];
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  addr = this->pc;
  this->pc = addr + 1;
  bVar2 = Bus::Read8(this->bus,addr,true);
  local_88[0] = (ulong)(this->field_0).af;
  local_78 = (ulong)(this->field_1).bc;
  local_68 = (ulong)(this->field_2).de;
  local_58 = (ulong)(this->field_3).hl;
  local_48 = (ulong)this->sp;
  local_38 = (ulong)this->pc_at_opcode;
  local_28 = (ulong)bVar2;
  fmt.size_ = 0x4a;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  AND 0x{:02X}\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_88;
  args.desc_ = 0x2222222;
  ::fmt::v11::vprint(fmt,args);
  puVar1 = &(this->field_0).field_1.a;
  *puVar1 = *puVar1 & bVar2;
  (this->field_0).field_1.f = ((*puVar1 != '\0') << 7 | (this->field_0).field_1.f & 0xf) + 0xa0;
  return;
}

Assistant:

void SM83::and_d8() {
    u8 value = GetByteFromPC();
    LTRACE("AND 0x{:02X}", value);

    a &= value;

    SetZeroFlag(a == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(true);
    SetCarryFlag(false);
}